

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O1

int program_filter_close(archive_read_filter *self)

{
  program_filter *state;
  int iVar1;
  
  state = (program_filter *)self->data;
  iVar1 = child_stop(self,state);
  free(state->out_buf);
  archive_string_free((archive_string *)state);
  free(state);
  return iVar1;
}

Assistant:

static int
program_filter_close(struct archive_read_filter *self)
{
	struct program_filter	*state;
	int e;

	state = (struct program_filter *)self->data;
	e = child_stop(self, state);

	/* Release our private data. */
	free(state->out_buf);
	archive_string_free(&state->description);
	free(state);

	return (e);
}